

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

void stbir__encode_scanline
               (stbir__info *stbir_info,int num_pixels,void *output_buffer,float *encode_buffer,
               int channels,int alpha_channel,int decode)

{
  stbir_uint8 sVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float local_118;
  int index_7;
  int pixel_index_8;
  int index_6;
  int pixel_index_7;
  int index_5;
  int pixel_index_6;
  int index_4;
  int pixel_index_5;
  int index_3;
  int pixel_index_4;
  int index_2;
  int pixel_index_3;
  int index_1;
  int pixel_index_2;
  int index;
  int pixel_index_1;
  float reciprocal_alpha;
  float alpha;
  int pixel_index;
  stbir_uint16 nonalpha [64];
  int local_3c;
  int local_38;
  int num_nonalpha;
  int n;
  int x;
  int alpha_channel_local;
  int channels_local;
  float *encode_buffer_local;
  void *output_buffer_local;
  int num_pixels_local;
  stbir__info *stbir_info_local;
  
  if ((stbir_info->flags & 1) == 0) {
    for (num_nonalpha = 0; num_nonalpha < num_pixels; num_nonalpha = num_nonalpha + 1) {
      local_118 = encode_buffer[num_nonalpha * channels + alpha_channel];
      if ((local_118 != 0.0) || (NAN(local_118))) {
        local_118 = 1.0 / local_118;
      }
      else {
        local_118 = 0.0;
      }
      for (local_38 = 0; local_38 < channels; local_38 = local_38 + 1) {
        if (local_38 != alpha_channel) {
          iVar3 = num_nonalpha * channels + local_38;
          encode_buffer[iVar3] = local_118 * encode_buffer[iVar3];
        }
      }
    }
  }
  local_3c = 0;
  for (num_nonalpha = 0; num_nonalpha < channels; num_nonalpha = num_nonalpha + 1) {
    if ((num_nonalpha != alpha_channel) || ((stbir_info->flags & 2) != 0)) {
      *(short *)((long)&alpha + (long)local_3c * 2) = (short)num_nonalpha;
      local_3c = local_3c + 1;
    }
  }
  switch(decode) {
  case 0:
    for (num_nonalpha = 0; num_nonalpha < num_pixels; num_nonalpha = num_nonalpha + 1) {
      for (local_38 = 0; local_38 < channels; local_38 = local_38 + 1) {
        iVar3 = num_nonalpha * channels + local_38;
        fVar4 = stbir__saturate(encode_buffer[iVar3]);
        *(char *)((long)output_buffer + (long)iVar3) = (char)(int)(fVar4 * 255.0 + 0.5);
      }
    }
    break;
  case 1:
    for (num_nonalpha = 0; num_nonalpha < num_pixels; num_nonalpha = num_nonalpha + 1) {
      iVar3 = num_nonalpha * channels;
      for (local_38 = 0; local_38 < local_3c; local_38 = local_38 + 1) {
        iVar2 = iVar3 + (uint)*(ushort *)((long)&alpha + (long)local_38 * 2);
        sVar1 = stbir__linear_to_srgb_uchar(encode_buffer[iVar2]);
        *(stbir_uint8 *)((long)output_buffer + (long)iVar2) = sVar1;
      }
      if ((stbir_info->flags & 2) == 0) {
        fVar4 = stbir__saturate(encode_buffer[iVar3 + alpha_channel]);
        *(char *)((long)output_buffer + (long)(iVar3 + alpha_channel)) =
             (char)(int)(fVar4 * 255.0 + 0.5);
      }
    }
    break;
  case 2:
    for (num_nonalpha = 0; num_nonalpha < num_pixels; num_nonalpha = num_nonalpha + 1) {
      for (local_38 = 0; local_38 < channels; local_38 = local_38 + 1) {
        iVar3 = num_nonalpha * channels + local_38;
        fVar4 = stbir__saturate(encode_buffer[iVar3]);
        *(short *)((long)output_buffer + (long)iVar3 * 2) = (short)(int)(fVar4 * 65535.0 + 0.5);
      }
    }
    break;
  case 3:
    for (num_nonalpha = 0; num_nonalpha < num_pixels; num_nonalpha = num_nonalpha + 1) {
      iVar3 = num_nonalpha * channels;
      for (local_38 = 0; local_38 < local_3c; local_38 = local_38 + 1) {
        iVar2 = iVar3 + (uint)*(ushort *)((long)&alpha + (long)local_38 * 2);
        fVar4 = stbir__saturate(encode_buffer[iVar2]);
        fVar4 = stbir__linear_to_srgb(fVar4);
        *(short *)((long)output_buffer + (long)iVar2 * 2) = (short)(int)(fVar4 * 65535.0 + 0.5);
      }
      if ((stbir_info->flags & 2) == 0) {
        fVar4 = stbir__saturate(encode_buffer[iVar3 + alpha_channel]);
        *(short *)((long)output_buffer + (long)(iVar3 + alpha_channel) * 2) =
             (short)(int)(fVar4 * 65535.0 + 0.5);
      }
    }
    break;
  case 4:
    for (num_nonalpha = 0; num_nonalpha < num_pixels; num_nonalpha = num_nonalpha + 1) {
      for (local_38 = 0; local_38 < channels; local_38 = local_38 + 1) {
        iVar3 = num_nonalpha * channels + local_38;
        fVar4 = stbir__saturate(encode_buffer[iVar3]);
        *(int *)((long)output_buffer + (long)iVar3 * 4) = (int)(long)(fVar4 * 4.2949673e+09 + 0.5);
      }
    }
    break;
  case 5:
    for (num_nonalpha = 0; num_nonalpha < num_pixels; num_nonalpha = num_nonalpha + 1) {
      iVar3 = num_nonalpha * channels;
      for (local_38 = 0; local_38 < local_3c; local_38 = local_38 + 1) {
        iVar2 = iVar3 + (uint)*(ushort *)((long)&alpha + (long)local_38 * 2);
        fVar4 = stbir__saturate(encode_buffer[iVar2]);
        fVar4 = stbir__linear_to_srgb(fVar4);
        *(int *)((long)output_buffer + (long)iVar2 * 4) = (int)(long)(fVar4 * 4.2949673e+09 + 0.5);
      }
      if ((stbir_info->flags & 2) == 0) {
        fVar4 = stbir__saturate(encode_buffer[iVar3 + alpha_channel]);
        *(int *)((long)output_buffer + (long)(iVar3 + alpha_channel) * 4) =
             (int)(fVar4 * 4.2949673e+09 + 0.5);
      }
    }
    break;
  case 6:
    for (num_nonalpha = 0; num_nonalpha < num_pixels; num_nonalpha = num_nonalpha + 1) {
      for (local_38 = 0; local_38 < channels; local_38 = local_38 + 1) {
        iVar3 = num_nonalpha * channels + local_38;
        *(float *)((long)output_buffer + (long)iVar3 * 4) = encode_buffer[iVar3];
      }
    }
    break;
  case 7:
    for (num_nonalpha = 0; num_nonalpha < num_pixels; num_nonalpha = num_nonalpha + 1) {
      iVar3 = num_nonalpha * channels;
      for (local_38 = 0; local_38 < local_3c; local_38 = local_38 + 1) {
        iVar2 = iVar3 + (uint)*(ushort *)((long)&alpha + (long)local_38 * 2);
        fVar4 = stbir__linear_to_srgb(encode_buffer[iVar2]);
        *(float *)((long)output_buffer + (long)iVar2 * 4) = fVar4;
      }
      if ((stbir_info->flags & 2) == 0) {
        *(float *)((long)output_buffer + (long)(iVar3 + alpha_channel) * 4) =
             encode_buffer[iVar3 + alpha_channel];
      }
    }
    break;
  default:
    __assert_fail("!\"Unknown type/colorspace/channels combination.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image_resize.h"
                  ,0x746,
                  "void stbir__encode_scanline(stbir__info *, int, void *, float *, int, int, int)")
    ;
  }
  return;
}

Assistant:

static void stbir__encode_scanline(stbir__info* stbir_info, int num_pixels, void *output_buffer, float *encode_buffer, int channels, int alpha_channel, int decode)
{
    int x;
    int n;
    int num_nonalpha;
    stbir_uint16 nonalpha[STBIR_MAX_CHANNELS];

    if (!(stbir_info->flags&STBIR_FLAG_ALPHA_PREMULTIPLIED))
    {
        for (x=0; x < num_pixels; ++x)
        {
            int pixel_index = x*channels;

            float alpha = encode_buffer[pixel_index + alpha_channel];
            float reciprocal_alpha = alpha ? 1.0f / alpha : 0;

            // unrolling this produced a 1% slowdown upscaling a large RGBA linear-space image on my machine - stb
            for (n = 0; n < channels; n++)
                if (n != alpha_channel)
                    encode_buffer[pixel_index + n] *= reciprocal_alpha;

            // We added in a small epsilon to prevent the color channel from being deleted with zero alpha.
            // Because we only add it for integer types, it will automatically be discarded on integer
            // conversion, so we don't need to subtract it back out (which would be problematic for
            // numeric precision reasons).
        }
    }

    // build a table of all channels that need colorspace correction, so
    // we don't perform colorspace correction on channels that don't need it.
    for (x = 0, num_nonalpha = 0; x < channels; ++x)
    {
        if (x != alpha_channel || (stbir_info->flags & STBIR_FLAG_ALPHA_USES_COLORSPACE))
        {
            nonalpha[num_nonalpha++] = (stbir_uint16)x;
        }
    }

    #define STBIR__ROUND_INT(f)    ((int)          ((f)+0.5))
    #define STBIR__ROUND_UINT(f)   ((stbir_uint32) ((f)+0.5))

    #ifdef STBIR__SATURATE_INT
    #define STBIR__ENCODE_LINEAR8(f)   stbir__saturate8 (STBIR__ROUND_INT((f) * stbir__max_uint8_as_float ))
    #define STBIR__ENCODE_LINEAR16(f)  stbir__saturate16(STBIR__ROUND_INT((f) * stbir__max_uint16_as_float))
    #else
    #define STBIR__ENCODE_LINEAR8(f)   (unsigned char ) STBIR__ROUND_INT(stbir__saturate(f) * stbir__max_uint8_as_float )
    #define STBIR__ENCODE_LINEAR16(f)  (unsigned short) STBIR__ROUND_INT(stbir__saturate(f) * stbir__max_uint16_as_float)
    #endif

    switch (decode)
    {
        case STBIR__DECODE(STBIR_TYPE_UINT8, STBIR_COLORSPACE_LINEAR):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < channels; n++)
                {
                    int index = pixel_index + n;
                    ((unsigned char*)output_buffer)[index] = STBIR__ENCODE_LINEAR8(encode_buffer[index]);
                }
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_UINT8, STBIR_COLORSPACE_SRGB):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < num_nonalpha; n++)
                {
                    int index = pixel_index + nonalpha[n];
                    ((unsigned char*)output_buffer)[index] = stbir__linear_to_srgb_uchar(encode_buffer[index]);
                }

                if (!(stbir_info->flags & STBIR_FLAG_ALPHA_USES_COLORSPACE))
                    ((unsigned char *)output_buffer)[pixel_index + alpha_channel] = STBIR__ENCODE_LINEAR8(encode_buffer[pixel_index+alpha_channel]);
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_UINT16, STBIR_COLORSPACE_LINEAR):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < channels; n++)
                {
                    int index = pixel_index + n;
                    ((unsigned short*)output_buffer)[index] = STBIR__ENCODE_LINEAR16(encode_buffer[index]);
                }
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_UINT16, STBIR_COLORSPACE_SRGB):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < num_nonalpha; n++)
                {
                    int index = pixel_index + nonalpha[n];
                    ((unsigned short*)output_buffer)[index] = (unsigned short)STBIR__ROUND_INT(stbir__linear_to_srgb(stbir__saturate(encode_buffer[index])) * stbir__max_uint16_as_float);
                }

                if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                    ((unsigned short*)output_buffer)[pixel_index + alpha_channel] = STBIR__ENCODE_LINEAR16(encode_buffer[pixel_index + alpha_channel]);
            }

            break;

        case STBIR__DECODE(STBIR_TYPE_UINT32, STBIR_COLORSPACE_LINEAR):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < channels; n++)
                {
                    int index = pixel_index + n;
                    ((unsigned int*)output_buffer)[index] = (unsigned int)STBIR__ROUND_UINT(((double)stbir__saturate(encode_buffer[index])) * stbir__max_uint32_as_float);
                }
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_UINT32, STBIR_COLORSPACE_SRGB):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < num_nonalpha; n++)
                {
                    int index = pixel_index + nonalpha[n];
                    ((unsigned int*)output_buffer)[index] = (unsigned int)STBIR__ROUND_UINT(((double)stbir__linear_to_srgb(stbir__saturate(encode_buffer[index]))) * stbir__max_uint32_as_float);
                }

                if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                    ((unsigned int*)output_buffer)[pixel_index + alpha_channel] = (unsigned int)STBIR__ROUND_INT(((double)stbir__saturate(encode_buffer[pixel_index + alpha_channel])) * stbir__max_uint32_as_float);
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_FLOAT, STBIR_COLORSPACE_LINEAR):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < channels; n++)
                {
                    int index = pixel_index + n;
                    ((float*)output_buffer)[index] = encode_buffer[index];
                }
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_FLOAT, STBIR_COLORSPACE_SRGB):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < num_nonalpha; n++)
                {
                    int index = pixel_index + nonalpha[n];
                    ((float*)output_buffer)[index] = stbir__linear_to_srgb(encode_buffer[index]);
                }

                if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                    ((float*)output_buffer)[pixel_index + alpha_channel] = encode_buffer[pixel_index + alpha_channel];
            }
            break;

        default:
            STBIR_ASSERT(!"Unknown type/colorspace/channels combination.");
            break;
    }
}